

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall
rsg::BoolLiteral::BoolLiteral
          (BoolLiteral *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  pointer pSVar1;
  bool bVar2;
  deUint32 dVar3;
  VariableType *type;
  int ndx;
  long lVar4;
  uint uVar5;
  uint uVar6;
  VariableType local_80;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__BoolLiteral_0018cdc0;
  type = VariableType::getScalarType(TYPE_BOOL);
  ValueStorage<64>::ValueStorage(&this->m_value,type);
  local_80.m_typeName._M_dataplus._M_p = (pointer)&local_80.m_typeName.field_2;
  local_80.m_baseType = TYPE_BOOL;
  local_80.m_precision = PRECISION_NONE;
  local_80.m_typeName._M_string_length = 0;
  local_80.m_typeName.field_2._M_local_buf[0] = '\0';
  local_80.m_numElements = 1;
  local_80.m_elementType = (VariableType *)0x0;
  local_80.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = VariableType::operator==(valueRange.m_type,&local_80);
  VariableType::~VariableType(&local_80);
  if (bVar2) {
    VariableType::getElementType(valueRange.m_type);
    uVar5 = (uint)(valueRange.m_min)->boolVal;
    VariableType::getElementType(valueRange.m_type);
    uVar6 = (uint)(valueRange.m_max)->boolVal;
  }
  else {
    uVar6 = 1;
    uVar5 = 0;
  }
  dVar3 = deRandom_getUint32(&state->m_random->m_rnd);
  VariableType::getScalarType(TYPE_BOOL);
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0;
  do {
    pSVar1[lVar4].boolVal = dVar3 % ((uVar6 - uVar5) + 1) + uVar5 == 1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  return;
}

Assistant:

BoolLiteral::BoolLiteral (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_value(VariableType::getScalarType(VariableType::TYPE_BOOL))
{
	int minVal = 0;
	int maxVal = 1;

	if (valueRange.getType() == VariableType(VariableType::TYPE_BOOL, 1))
	{
		minVal = valueRange.getMin().component(0).asBool() ? 1 : 0;
		maxVal = valueRange.getMax().component(0).asBool() ? 1 : 0;
	}

	bool			value	= state.getRandom().getInt(minVal, maxVal) == 1;
	ExecValueAccess	access	= m_value.getValue(VariableType::getScalarType(VariableType::TYPE_BOOL));

	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		access.asBool(ndx) = value;
}